

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteVarBounds
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  VarBndWriter vbw;
  VarBndWriter local_18;
  
  BinaryFormatter::apr
            (&this->super_FormatterType,&this->nm,"b\t#%d bounds (on variables)\n",
             (ulong)(uint)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars);
  local_18.nWrt_ = 0;
  local_18.nlw_ = this;
  NLFeeder_Easy::
  FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::VarBndWriter>
            (this->feeder_,&local_18);
  return;
}

Assistant:

void NLWriter2<Params>::WriteVarBounds() {
	apr(nm, "b\t#%d bounds (on variables)\n",
      (int)Hdr().num_vars);
  VarBndWriter vbw(*this);
  Feeder().FeedVarBounds(vbw);
  assert((int)Hdr().num_vars == vbw.GetNWritten());
}